

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::getp_write_int(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int32_t iVar4;
  uint uVar5;
  uchar *buf;
  ulong uVar6;
  unsigned_long uVar7;
  undefined8 in_RCX;
  vm_val_t *in_RDX;
  uchar cbuf [4];
  size_t siz;
  long val;
  uint fmt;
  uint idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffff88;
  uint *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  unsigned_long idx_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  unsigned_long in_stack_ffffffffffffffd0;
  vm_obj_id_t self_00;
  
  self_00 = (vm_obj_id_t)((ulong)in_RCX >> 0x20);
  if ((getp_write_int(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_write_int(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_write_int::desc,3);
    __cxa_guard_release(&getp_write_int(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (iVar1 != 0) {
    return 1;
  }
  uVar2 = CVmBif::pop_int_val();
  uVar3 = CVmBif::pop_int_val();
  iVar4 = CVmBif::pop_long_val();
  buf = (uchar *)(long)iVar4;
  uVar5 = uVar3 & 0xf;
  if (uVar5 != 0) {
    if (uVar5 == 1) {
      idx_00 = 2;
      goto LAB_00317eb5;
    }
    if (uVar5 == 2) {
      idx_00 = 4;
      goto LAB_00317eb5;
    }
  }
  idx_00 = 1;
LAB_00317eb5:
  if (uVar2 != 0) {
    uVar6 = (uVar2 + idx_00) - 1;
    uVar7 = get_element_count((CVmObjByteArray *)0x317ed8);
    if (uVar6 <= uVar7) {
      if (idx_00 == 1) {
        in_stack_ffffffffffffffac = CONCAT31((int3)((uint)in_stack_ffffffffffffffac >> 8),(char)buf)
        ;
      }
      else if (idx_00 == 2) {
        if ((uVar3 & 0xf00) == 0) {
          oswp2s(&stack0xffffffffffffffac,(uint)buf);
        }
        else {
          ::oswp2(&stack0xffffffffffffffac,(uint)buf);
        }
      }
      else if (idx_00 == 4) {
        if ((uVar3 & 0xf00) == 0) {
          oswp4s(&stack0xffffffffffffffac,(long)buf);
        }
        else {
          ::oswp4(&stack0xffffffffffffffac,(unsigned_long)buf);
        }
      }
      if ((1 < idx_00) && ((uVar3 & 0xf0) == 0x10)) {
        swap_bytes(&stack0xffffffffffffffac,(int)idx_00);
      }
      save_undo((CVmObjByteArray *)in_RDX,self_00,in_stack_ffffffffffffffd0,
                CONCAT44(in_stack_ffffffffffffffcc,uVar2));
      copy_from_buf((CVmObjByteArray *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),buf,idx_00,
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      vm_val_t::set_nil(in_RDX);
      return 1;
    }
  }
  err_throw(0);
}

Assistant:

int CVmObjByteArray::getp_write_int(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(3);
    unsigned int idx;
    unsigned int fmt;
    long val;
    size_t siz;
    unsigned char cbuf[4];

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the starting index, format code, and value to write */
    idx = CVmBif::pop_int_val(vmg0_);
    fmt = CVmBif::pop_int_val(vmg0_);
    val = CVmBif::pop_long_val(vmg0_);

    /* get the size from the format */
    switch (fmt & FmtSizeMask)
    {
    case FmtInt8:
    default:
        siz = 1;
        break;

    case FmtInt16:
        siz = 2;
        break;

    case FmtInt32:
        siz = 4;
        break;
    }

    /* check that the index is in range */
    if (idx < 1 || idx + siz - 1 > get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* write the value to cbuf[] */
    switch (siz)
    {
    case 1:
        /* 8-bit integer */
        cbuf[0] = (char)(val & 0xFF);
        break;

    case 2:
        /* 16-bit integer - start with our standard little-endian format */
        if ((fmt & FmtSignedMask) == FmtSigned)
            oswp2s(cbuf, (int)val);
        else
            oswp2(cbuf, (int)val);
        break;

    case 4:
        /* 32-bit integer - start with our standard little-endian format */
        if ((fmt & FmtSignedMask) == FmtSigned)
            oswp4s(cbuf, val);
        else
            oswp4(cbuf, val);
        break;
    }

    /* swap bytes if they want big-endian */
    if (siz > 1 && (fmt & FmtOrderMask) == FmtBigEndian)
        swap_bytes(cbuf, siz);

    /* save undo for the change */
    save_undo(vmg_ self, idx, siz);

    /* store the byte representation we've constructed */
    copy_from_buf(cbuf, idx, siz);
    
    /* there's no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}